

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.h
# Opt level: O1

void __thiscall Plane::prepare_coords(Plane *this)

{
  Vector3f *this_00;
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  int i;
  undefined1 auVar5 [16];
  Vector3f v2;
  Vector3f v1;
  Vector3f local_90;
  Vector3f local_84;
  Matrix3f local_78;
  Matrix3f local_54;
  
  Vector3f::Vector3f(&local_84,0.0);
  Vector3f::Vector3f(&local_90,0.0);
  Vector3f::operator=(&this->o,&Vector3f::ZERO);
  this_00 = &this->norm;
  i = 0;
  pfVar4 = Vector3f::operator[](this_00,0);
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(ZEXT416((uint)*pfVar4),auVar5);
  if (auVar5._0_4_ <= 0.0001) {
    pfVar4 = Vector3f::operator[](this_00,1);
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx512vl(ZEXT416((uint)*pfVar4),auVar3);
    i = (auVar5._0_4_ <= 0.0001) + 1;
  }
  fVar1 = this->d;
  pfVar4 = Vector3f::operator[](this_00,i);
  fVar2 = *pfVar4;
  pfVar4 = Vector3f::operator[](&this->o,i);
  *pfVar4 = fVar1 / fVar2;
  createCoordinateSystem(this_00,&local_84,&local_90);
  Matrix3f::Matrix3f(&local_78,this_00,&local_84,&local_90,true);
  Matrix3f::inverse(&local_54,&local_78,(bool *)0x0,0.0);
  Matrix3f::operator=(&this->matrix,&local_54);
  return;
}

Assistant:

void prepare_coords() {
		Vector3f v1, v2;
		o = Vector3f::ZERO;
		if (fabs(norm[0]) > 1e-4) o[0] = d / norm[0];
		else if (fabs(norm[1]) > 1e-4) o[1] = d / norm[1];
		else o[2] = d / norm[2];
		createCoordinateSystem(norm, v1, v2);
		//norm,v1,v2 factorization
		matrix = Matrix3f(norm, v1, v2).inverse();
	}